

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

Maybe<capnp::Schema> __thiscall
capnp::SchemaLoader::tryGet(SchemaLoader *this,uint64_t id,Reader brand,Schema scope)

{
  Reader RVar1;
  RawSchema *schema;
  uint uVar2;
  Own<capnp::SchemaLoader::Impl> *pOVar3;
  Impl *pIVar4;
  RawBrandedSchema *this_00;
  long in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar5;
  TryGetResult TVar6;
  Maybe<capnp::Schema> MVar7;
  Schema local_130;
  Schema local_128;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> local_120;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_110;
  SegmentReader *local_f8;
  CapTableReader *pCStack_f0;
  void *local_e8;
  WirePointer *pWStack_e0;
  undefined8 local_d8;
  int iStack_d0;
  undefined4 uStack_cc;
  undefined1 local_c8 [24];
  RawBrandedSchema *brandedSchema;
  undefined1 local_80 [24];
  Maybe<const_capnp::SchemaLoader::LazyLoadCallback_&> local_68;
  Impl *local_60;
  LazyLoadCallback *c;
  RawSchema *local_38;
  TryGetResult getResult;
  uint64_t id_local;
  SchemaLoader *this_local;
  Schema scope_local;
  
  getResult.callback.ptr = (LazyLoadCallback *)scope.raw;
  kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>_>::lockShared
            ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>_> *)&stack0xffffffffffffffb8);
  pOVar3 = kj::Locked<const_kj::Own<capnp::SchemaLoader::Impl>_>::operator->
                     ((Locked<const_kj::Own<capnp::SchemaLoader::Impl>_> *)&stack0xffffffffffffffb8)
  ;
  pIVar4 = kj::Own<capnp::SchemaLoader::Impl>::get(pOVar3);
  TVar6 = Impl::tryGet(pIVar4,(uint64_t)getResult.callback.ptr);
  getResult.schema = (RawSchema *)TVar6.callback.ptr;
  local_38 = TVar6.schema;
  kj::Locked<const_kj::Own<capnp::SchemaLoader::Impl>_>::~Locked
            ((Locked<const_kj::Own<capnp::SchemaLoader::Impl>_> *)&stack0xffffffffffffffb8);
  if ((local_38 == (RawSchema *)0x0) || (local_38->lazyInitializer != (Initializer *)0x0)) {
    local_60 = (Impl *)kj::_::readMaybe<capnp::SchemaLoader::LazyLoadCallback_const>
                                 ((Maybe<const_capnp::SchemaLoader::LazyLoadCallback_&> *)&getResult
                                 );
    if (local_60 != (Impl *)0x0) {
      (**(_func_int **)(local_60->arena).nextChunkSize)(local_60,id,getResult.callback.ptr);
    }
    kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>_>::lockShared
              ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>_> *)local_80);
    pOVar3 = kj::Locked<const_kj::Own<capnp::SchemaLoader::Impl>_>::operator->
                       ((Locked<const_kj::Own<capnp::SchemaLoader::Impl>_> *)local_80);
    pIVar4 = kj::Own<capnp::SchemaLoader::Impl>::get(pOVar3);
    join_0x00000010_0x00000000_ = Impl::tryGet(pIVar4,(uint64_t)getResult.callback.ptr);
    getResult.schema = (RawSchema *)local_80._24_8_;
    local_38 = local_80._16_8_;
    kj::Locked<const_kj::Own<capnp::SchemaLoader::Impl>_>::~Locked
              ((Locked<const_kj::Own<capnp::SchemaLoader::Impl>_> *)local_80);
  }
  if ((local_38 == (RawSchema *)0x0) || (local_38->lazyInitializer != (Initializer *)0x0)) {
    kj::Maybe<capnp::Schema>::Maybe((Maybe<capnp::Schema> *)this,(void *)0x0);
    aVar5 = extraout_RDX_01;
  }
  else {
    capnp::schema::Brand::Reader::getScopes((Reader *)&brandedSchema,&brand);
    uVar2 = List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader::size
                      ((Reader *)&brandedSchema);
    if (uVar2 == 0) {
      Schema::Schema(&local_130,&local_38->defaultBrand);
      kj::Maybe<capnp::Schema>::Maybe((Maybe<capnp::Schema> *)this,&local_130);
      aVar5 = extraout_RDX_00;
    }
    else {
      kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>_>::lockExclusive
                ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>_> *)local_c8);
      pOVar3 = kj::Locked<kj::Own<capnp::SchemaLoader::Impl>_>::operator->
                         ((Locked<kj::Own<capnp::SchemaLoader::Impl>_> *)local_c8);
      pIVar4 = kj::Own<capnp::SchemaLoader::Impl>::get(pOVar3);
      schema = local_38;
      RVar1 = brand;
      local_f8 = brand._reader.segment;
      pCStack_f0 = brand._reader.capTable;
      local_e8 = brand._reader.data;
      pWStack_e0 = brand._reader.pointers;
      local_d8._0_4_ = brand._reader.dataSize;
      local_d8._4_2_ = brand._reader.pointerCount;
      local_d8._6_2_ = brand._reader._38_2_;
      brand._reader._40_8_ = RVar1._reader._40_8_;
      iStack_d0 = brand._reader.nestingLimit;
      uStack_cc = brand._reader._44_4_;
      brand = RVar1;
      local_120 = kj::arrayPtr<capnp::_::RawBrandedSchema::Scope_const>
                            (*(Scope **)(in_RCX + 8),(ulong)*(uint *)(in_RCX + 0x18));
      kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::Maybe
                (&local_110,&local_120);
      RVar1._reader.capTable = pCStack_f0;
      RVar1._reader.segment = local_f8;
      RVar1._reader.data = local_e8;
      RVar1._reader.pointers = pWStack_e0;
      RVar1._reader.dataSize = (StructDataBitCount)local_d8;
      RVar1._reader.pointerCount = local_d8._4_2_;
      RVar1._reader._38_2_ = local_d8._6_2_;
      RVar1._reader.nestingLimit = iStack_d0;
      RVar1._reader._44_4_ = uStack_cc;
      this_00 = Impl::makeBranded(pIVar4,schema,RVar1,&local_110);
      kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::~Maybe(&local_110);
      kj::Locked<kj::Own<capnp::SchemaLoader::Impl>_>::~Locked
                ((Locked<kj::Own<capnp::SchemaLoader::Impl>_> *)local_c8);
      local_c8._16_8_ = this_00;
      capnp::_::RawBrandedSchema::ensureInitialized(this_00);
      Schema::Schema(&local_128,(RawBrandedSchema *)local_c8._16_8_);
      kj::Maybe<capnp::Schema>::Maybe((Maybe<capnp::Schema> *)this,&local_128);
      aVar5 = extraout_RDX;
    }
  }
  MVar7.ptr.field_1 = aVar5;
  MVar7.ptr._0_8_ = this;
  return (Maybe<capnp::Schema>)MVar7.ptr;
}

Assistant:

kj::Maybe<Schema> SchemaLoader::tryGet(
    uint64_t id, schema::Brand::Reader brand, Schema scope) const {
  auto getResult = impl.lockShared()->get()->tryGet(id);
  if (getResult.schema == nullptr || getResult.schema->lazyInitializer != nullptr) {
    // This schema couldn't be found or has yet to be lazily loaded. If we have a lazy loader
    // callback, invoke it now to try to get it to load this schema.
    KJ_IF_MAYBE(c, getResult.callback) {
      c->load(*this, id);
    }
    getResult = impl.lockShared()->get()->tryGet(id);
  }
  if (getResult.schema != nullptr && getResult.schema->lazyInitializer == nullptr) {
    if (brand.getScopes().size() > 0) {
      auto brandedSchema = impl.lockExclusive()->get()->makeBranded(
          getResult.schema, brand, kj::arrayPtr(scope.raw->scopes, scope.raw->scopeCount));
      brandedSchema->ensureInitialized();
      return Schema(brandedSchema);
    } else {
      return Schema(&getResult.schema->defaultBrand);
    }
  } else {
    return nullptr;
  }
}